

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakevfs.cpp
# Opt level: O1

void QMakeVfs::deref(void)

{
  s_refCount = s_refCount + -1;
  if (s_refCount != 0) {
    return;
  }
  s_fileIdCounter.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i = (QAtomicInteger<int>)(QBasicAtomicInteger<int>)0x0;
  QHash<QString,_int>::clear(&s_fileIdMap);
  QHash<int,_QString>::clear(&s_idFileMap);
  return;
}

Assistant:

void QMakeVfs::deref()
{
#ifdef PROEVALUATOR_THREAD_SAFE
    QMutexLocker locker(&s_mutex);
#endif
    if (!--s_refCount) {
        s_fileIdCounter = 0;
        s_fileIdMap.clear();
        s_idFileMap.clear();
    }
}